

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::detail::formatTruncated<int>(ostream *out,int *value,int ntrunc)

{
  int *piVar1;
  long lVar2;
  int local_1cc;
  string local_1c8 [8];
  string result;
  ostringstream local_198 [8];
  ostringstream tmp;
  int local_1c;
  int *piStack_18;
  int ntrunc_local;
  int *value_local;
  ostream *out_local;
  
  local_1c = ntrunc;
  piStack_18 = value;
  value_local = (int *)out;
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::operator<<(local_198,*piStack_18);
  std::__cxx11::ostringstream::str();
  piVar1 = value_local;
  lVar2 = std::__cxx11::string::c_str();
  local_1cc = std::__cxx11::string::size();
  std::min<int>(&local_1c,&local_1cc);
  std::ostream::write((char *)piVar1,lVar2);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

inline void formatTruncated(std::ostream& out, const T& value, int ntrunc)
{
    std::ostringstream tmp;
    tmp << value;
    std::string result = tmp.str();
    out.write(result.c_str(), (std::min)(ntrunc, static_cast<int>(result.size())));
}